

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBlobImpl.cpp
# Opt level: O3

void __thiscall Diligent::DataBlobAllocatorAdapter::Free(DataBlobAllocatorAdapter *this,void *Ptr)

{
  DataBlobImpl *pDVar1;
  string msg;
  string local_38;
  
  pDVar1 = (this->m_pDataBlob).m_pObject;
  if (pDVar1 == (DataBlobImpl *)0x0) {
    FormatString<char[30]>(&local_38,(char (*) [30])"Memory has not been allocated");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
               ,0x79);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pDVar1 = (this->m_pDataBlob).m_pObject;
  }
  if ((pDVar1->m_DataBuff).
      super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)Ptr) {
    FormatString<char[25]>(&local_38,(char (*) [25])"Incorrect memory pointer");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
               ,0x7a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  RefCntAutoPtr<Diligent::DataBlobImpl>::Release(&this->m_pDataBlob);
  return;
}

Assistant:

void DataBlobAllocatorAdapter::Free(void* Ptr)
{
    VERIFY(m_pDataBlob, "Memory has not been allocated");
    VERIFY(m_pDataBlob->GetDataPtr() == Ptr, "Incorrect memory pointer");
    m_pDataBlob.Release();
}